

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::connect
          (NetworkAddressHttpClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  AsyncIoStream **this_00;
  RefcountedClient *pRVar1;
  HttpClientImpl *pHVar2;
  RefOrVoid<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient> object;
  undefined4 in_register_0000000c;
  HttpConnectSettings *in_R9;
  undefined1 local_a8 [72];
  undefined1 local_60 [8];
  ConnectRequest request;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
  refcounted;
  HttpConnectSettings *settings_local;
  HttpHeaders *headers_local;
  NetworkAddressHttpClient *this_local;
  StringPtr host_local;
  
  this_00 = &request.connection.ptr;
  getClient((NetworkAddressHttpClient *)this_00);
  pRVar1 = Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
           ::operator->((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
                         *)this_00);
  pHVar2 = Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t>::operator->
                     (&pRVar1->client);
  local_a8._32_8_ = __addr;
  local_a8._40_8_ = (EventLoop *)CONCAT44(in_register_0000000c,__len);
  HttpConnectSettings::HttpConnectSettings((HttpConnectSettings *)(local_a8 + 0x10),in_R9);
  HttpClientImpl::connect
            ((HttpClientImpl *)local_60,(int)pHVar2,(sockaddr *)local_a8._32_8_,
             (socklen_t)local_a8._40_8_);
  object = Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
           ::operator*((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
                        *)&request.connection.ptr);
  addRef<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient>
            ((kj *)local_a8,object);
  Promise<kj::HttpClient::ConnectRequest::Status>::
  attach<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,decltype(nullptr)>>
            ((Promise<kj::HttpClient::ConnectRequest::Status> *)this,
             (Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
              *)local_60);
  mv<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,decltype(nullptr)>>
            ((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
              *)&request.connection.ptr);
  Own<kj::AsyncIoStream,decltype(nullptr)>::
  attach<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,decltype(nullptr)>>
            ((Own<kj::AsyncIoStream,decltype(nullptr)> *)&this->timer,
             (Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
              *)&request);
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
              *)local_a8);
  HttpClient::ConnectRequest::~ConnectRequest((ConnectRequest *)local_60);
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
              *)&request.connection.ptr);
  return (int)this;
}

Assistant:

ConnectRequest connect(
      kj::StringPtr host, const HttpHeaders& headers, HttpConnectSettings settings) override {
    auto refcounted = getClient();
    auto request = refcounted->client->connect(host, headers, settings);
    return ConnectRequest {
      request.status.attach(kj::addRef(*refcounted)),
      request.connection.attach(kj::mv(refcounted))
    };
  }